

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_expectNoCallInScopeThatHappened_TestShell::
~TEST_MockCallTest_expectNoCallInScopeThatHappened_TestShell
          (TEST_MockCallTest_expectNoCallInScopeThatHappened_TestShell *this)

{
  TEST_MockCallTest_expectNoCallInScopeThatHappened_TestShell *this_local;
  
  ~TEST_MockCallTest_expectNoCallInScopeThatHappened_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockCallTest, expectNoCallInScopeThatHappened)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction(0, "scope::lazy");
    MockUnexpectedCallHappenedFailure expectedFailure(mockFailureTest(), "scope::lazy", expectations);

    mock("scope").expectNoCall("lazy");
    mock("scope").actualCall("lazy");

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}